

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_reduce.cpp
# Opt level: O0

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>
duckdb::ListReduceBind
          (ClientContext *context,ScalarFunction *bound_function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments)

{
  BaseExpression *pBVar1;
  ExpressionClass EVar2;
  bool bVar3;
  pointer pEVar4;
  BinderException *pBVar5;
  size_type sVar6;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  *in_RCX;
  BaseExpression *in_RSI;
  unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_> in_RDI;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> cast_lambda_expr;
  bool has_max_logical_type;
  LogicalType max_logical_type;
  LogicalType initial_value_type;
  bool has_initial;
  LogicalType list_child_type;
  unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> bind_data;
  bool has_index;
  BoundLambdaExpression *bound_lambda_expr;
  LogicalType *in_stack_fffffffffffffd68;
  LogicalType *in_stack_fffffffffffffd70;
  LogicalType *in_stack_fffffffffffffd78;
  BaseExpression *in_stack_fffffffffffffdb0;
  reference in_stack_fffffffffffffdb8;
  reference in_stack_fffffffffffffdc0;
  BaseExpression *in_stack_fffffffffffffdc8;
  ScalarFunction *in_stack_fffffffffffffdf8;
  ClientContext *in_stack_fffffffffffffe00;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  *in_stack_fffffffffffffe08;
  allocator local_191;
  string local_190 [32];
  undefined1 local_170 [8];
  undefined1 local_168 [8];
  undefined1 local_160 [8];
  undefined1 local_158 [8];
  LogicalType local_150 [24];
  undefined1 local_138 [8];
  undefined1 local_130 [14];
  undefined1 local_122;
  allocator local_121;
  string local_120 [39];
  byte local_f9;
  LogicalType local_f8 [24];
  LogicalType local_e0 [31];
  undefined1 local_c1;
  LogicalType local_c0 [28];
  undefined4 local_a4;
  undefined1 local_93;
  undefined1 local_92;
  allocator local_91;
  string local_90 [32];
  BoundLambdaExpression *local_70;
  undefined1 local_68 [8];
  undefined1 local_60 [11];
  undefined1 local_55;
  allocator local_41;
  string local_40 [32];
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  *local_20;
  BaseExpression *local_10;
  
  local_20 = in_RCX;
  local_10 = in_RSI;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                *)in_stack_fffffffffffffd70,(size_type)in_stack_fffffffffffffd68);
  pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                       *)in_stack_fffffffffffffd70);
  EVar2 = BaseExpression::GetExpressionClass((BaseExpression *)pEVar4);
  pBVar1 = local_10;
  if (EVar2 != BOUND_LAMBDA) {
    local_55 = 1;
    pBVar5 = (BinderException *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_40,"Invalid lambda expression!",&local_41);
    duckdb::BinderException::BinderException(pBVar5,local_40);
    local_55 = 0;
    __cxa_throw(pBVar5,&BinderException::typeinfo,BinderException::~BinderException);
  }
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                *)in_stack_fffffffffffffd70,(size_type)in_stack_fffffffffffffd68);
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::unique_ptr
            ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             in_stack_fffffffffffffd70,
             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             in_stack_fffffffffffffd68);
  duckdb::BoundCastExpression::AddArrayCastToList(local_60,pBVar1,local_68);
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                *)in_stack_fffffffffffffd70,(size_type)in_stack_fffffffffffffd68);
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator=
            ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             in_stack_fffffffffffffd70,
             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             in_stack_fffffffffffffd68);
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::~unique_ptr
            ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             0xd5b227);
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::~unique_ptr
            ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             0xd5b234);
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                *)in_stack_fffffffffffffd70,(size_type)in_stack_fffffffffffffd68);
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
            ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             in_stack_fffffffffffffd70);
  local_70 = BaseExpression::Cast<duckdb::BoundLambdaExpression>(in_stack_fffffffffffffdb0);
  if ((*(ulong *)(local_70 + 0x78) < 2) || (3 < *(ulong *)(local_70 + 0x78))) {
    local_92 = 1;
    pBVar5 = (BinderException *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_90,"list_reduce expects a function with 2 or 3 arguments",&local_91);
    duckdb::BinderException::BinderException(pBVar5,local_90);
    local_92 = 0;
    __cxa_throw(pBVar5,&BinderException::typeinfo,BinderException::~BinderException);
  }
  local_93 = *(long *)(local_70 + 0x78) == 3;
  LambdaFunctions::ListLambdaPrepareBind
            (in_stack_fffffffffffffe08,in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
  bVar3 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_> *
                     )0xd5b402);
  if (bVar3) {
    unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>::unique_ptr
              ((unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> *)
               in_stack_fffffffffffffd70,
               (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> *)
               in_stack_fffffffffffffd68);
    local_a4 = 1;
  }
  else {
    vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
    ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                  *)in_stack_fffffffffffffd70,(size_type)in_stack_fffffffffffffd68);
    pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                         *)in_stack_fffffffffffffd70);
    duckdb::LogicalType::LogicalType(local_c0,(LogicalType *)(pEVar4 + 0x38));
    duckdb::ListType::GetChildType(local_c0);
    LogicalType::operator=(in_stack_fffffffffffffd78,in_stack_fffffffffffffd70);
    sVar6 = std::
            vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            ::size(local_20);
    local_c1 = sVar6 == 3;
    if ((bool)local_c1) {
      vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
      ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                    *)in_stack_fffffffffffffd70,(size_type)in_stack_fffffffffffffd68);
      pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                           *)in_stack_fffffffffffffd70);
      duckdb::LogicalType::LogicalType(local_e0,(LogicalType *)(pEVar4 + 0x38));
      bVar3 = LogicalType::operator!=(in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
      if (bVar3) {
        duckdb::LogicalType::LogicalType(local_f8);
        local_f9 = duckdb::LogicalType::TryGetMaxLogicalType
                             ((ClientContext *)local_10,local_c0,local_e0,local_f8);
        local_f9 = local_f9 & 1;
        if (local_f9 == 0) {
          local_122 = 1;
          pBVar5 = (BinderException *)__cxa_allocate_exception(0x10);
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_120,
                     "The initial value type must be the same as the list child type or a common super type"
                     ,&local_121);
          duckdb::BinderException::BinderException(pBVar5,local_120);
          local_122 = 0;
          __cxa_throw(pBVar5,&BinderException::typeinfo,BinderException::~BinderException);
        }
        LogicalType::operator=(in_stack_fffffffffffffd78,in_stack_fffffffffffffd70);
        in_stack_fffffffffffffdc8 = local_10;
        vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
        ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                      *)in_stack_fffffffffffffd70,(size_type)in_stack_fffffffffffffd68);
        unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::unique_ptr
                  ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   in_stack_fffffffffffffd70,
                   (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   in_stack_fffffffffffffd68);
        duckdb::LogicalType::LIST(local_150);
        duckdb::BoundCastExpression::AddCastToType
                  (local_130,in_stack_fffffffffffffdc8,local_138,local_150,0);
        in_stack_fffffffffffffdc0 =
             vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                           *)in_stack_fffffffffffffd70,(size_type)in_stack_fffffffffffffd68);
        unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator=
                  ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   in_stack_fffffffffffffd70,
                   (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   in_stack_fffffffffffffd68);
        unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::~unique_ptr
                  ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   0xd5b7ab);
        duckdb::LogicalType::~LogicalType(local_150);
        unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::~unique_ptr
                  ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   0xd5b7c5);
        in_stack_fffffffffffffdb0 = local_10;
        in_stack_fffffffffffffdb8 =
             vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                           *)in_stack_fffffffffffffd70,(size_type)in_stack_fffffffffffffd68);
        unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::unique_ptr
                  ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   in_stack_fffffffffffffd70,
                   (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   in_stack_fffffffffffffd68);
        duckdb::BoundCastExpression::AddCastToType
                  (local_158,in_stack_fffffffffffffdb0,local_160,local_f8,0);
        vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
        ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                      *)in_stack_fffffffffffffd70,(size_type)in_stack_fffffffffffffd68);
        unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator=
                  ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   in_stack_fffffffffffffd70,
                   (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   in_stack_fffffffffffffd68);
        unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::~unique_ptr
                  ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   0xd5b85e);
        unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::~unique_ptr
                  ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   0xd5b86b);
        duckdb::LogicalType::~LogicalType(local_f8);
      }
      duckdb::LogicalType::~LogicalType(local_e0);
    }
    unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::unique_ptr
              ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               in_stack_fffffffffffffd70,
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               in_stack_fffffffffffffd68);
    duckdb::BoundCastExpression::AddCastToType(local_168,local_10,local_170,local_c0,0);
    unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::~unique_ptr
              ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               0xd5b9b6);
    bVar3 = std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_> *)
                       0xd5b9c3);
    if (!bVar3) {
      pBVar5 = (BinderException *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_190,"Could not cast lambda expression to list child type",&local_191);
      duckdb::BinderException::BinderException(pBVar5,local_190);
      __cxa_throw(pBVar5,&BinderException::typeinfo,BinderException::~BinderException);
    }
    pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                         *)in_stack_fffffffffffffd70);
    LogicalType::operator=(in_stack_fffffffffffffd78,(LogicalType *)pEVar4);
    make_uniq<duckdb::ListLambdaBindData,duckdb::LogicalType&,duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,bool&,bool&>
              ((LogicalType *)in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0,
               (bool *)in_stack_fffffffffffffdb8,(bool *)in_stack_fffffffffffffdb0);
    unique_ptr<duckdb::FunctionData,std::default_delete<duckdb::FunctionData>,true>::
    unique_ptr<duckdb::ListLambdaBindData,std::default_delete<std::unique_ptr<duckdb::FunctionData,std::default_delete<duckdb::FunctionData>>>,void>
              ((unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> *)
               pEVar4,(unique_ptr<duckdb::ListLambdaBindData,_std::default_delete<duckdb::ListLambdaBindData>_>
                       *)in_stack_fffffffffffffd68);
    unique_ptr<duckdb::ListLambdaBindData,_std::default_delete<duckdb::ListLambdaBindData>,_true>::
    ~unique_ptr((unique_ptr<duckdb::ListLambdaBindData,_std::default_delete<duckdb::ListLambdaBindData>,_true>
                 *)0xd5bb56);
    local_a4 = 1;
    unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::~unique_ptr
              ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               0xd5bb6e);
    duckdb::LogicalType::~LogicalType(local_c0);
  }
  unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>::~unique_ptr
            ((unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> *)
             0xd5bbba);
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (__uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         in_RDI._M_t.
         super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>.
         _M_t.
         super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
         super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl;
}

Assistant:

static unique_ptr<FunctionData> ListReduceBind(ClientContext &context, ScalarFunction &bound_function,
                                               vector<unique_ptr<Expression>> &arguments) {

	// the list column and the bound lambda expression
	D_ASSERT(arguments.size() == 2 || arguments.size() == 3);
	if (arguments[1]->GetExpressionClass() != ExpressionClass::BOUND_LAMBDA) {
		throw BinderException("Invalid lambda expression!");
	}

	arguments[0] = BoundCastExpression::AddArrayCastToList(context, std::move(arguments[0]));

	auto &bound_lambda_expr = arguments[1]->Cast<BoundLambdaExpression>();
	if (bound_lambda_expr.parameter_count < 2 || bound_lambda_expr.parameter_count > 3) {
		throw BinderException("list_reduce expects a function with 2 or 3 arguments");
	}
	auto has_index = bound_lambda_expr.parameter_count == 3;

	unique_ptr<FunctionData> bind_data = LambdaFunctions::ListLambdaPrepareBind(arguments, context, bound_function);
	if (bind_data) {
		return bind_data;
	}

	auto list_child_type = arguments[0]->return_type;
	list_child_type = ListType::GetChildType(list_child_type);

	bool has_initial = arguments.size() == 3;
	if (has_initial) {
		const auto initial_value_type = arguments[2]->return_type;
		// Check if the initial value type is the same as the list child type and if not find the max logical type
		if (list_child_type != initial_value_type) {
			LogicalType max_logical_type;
			const auto has_max_logical_type =
			    LogicalType::TryGetMaxLogicalType(context, list_child_type, initial_value_type, max_logical_type);
			if (!has_max_logical_type) {
				throw BinderException(
				    "The initial value type must be the same as the list child type or a common super type");
			}

			list_child_type = max_logical_type;
			arguments[0] = BoundCastExpression::AddCastToType(context, std::move(arguments[0]),
			                                                  LogicalType::LIST(max_logical_type));
			arguments[2] = BoundCastExpression::AddCastToType(context, std::move(arguments[2]), max_logical_type);
		}
	}

	auto cast_lambda_expr =
	    BoundCastExpression::AddCastToType(context, std::move(bound_lambda_expr.lambda_expr), list_child_type);
	if (!cast_lambda_expr) {
		throw BinderException("Could not cast lambda expression to list child type");
	}
	bound_function.return_type = cast_lambda_expr->return_type;
	return make_uniq<ListLambdaBindData>(bound_function.return_type, std::move(cast_lambda_expr), has_index,
	                                     has_initial);
}